

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void doubles(void)

{
  size_t unaff_retaddr;
  rtosc_arg_val_t *in_stack_00000008;
  rtosc_arg_val_t *in_stack_00000010;
  rtosc_arg_val_t *in_stack_00000018;
  rtosc_cmp_options very_tolerant;
  int in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  int in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  rtosc_cmp_options *in_stack_fffffffffffffff0;
  size_t in_stack_fffffffffffffff8;
  rtosc_cmp_options *opt;
  
  r[0].type = 'd';
  l[0].type = 'd';
  l[0].val.s = (char *)0x419d6f34587e6b75;
  r[0].val.s = (char *)0x419d6f3454000000;
  cmp_gt(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
         in_stack_fffffffffffffff0,
         (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
         (char *)CONCAT44(very_tolerant.float_tolerance._4_4_,very_tolerant.float_tolerance._0_4_),
         in_stack_00000028);
  r[0].type = 'd';
  l[0].type = 'd';
  l[0].val.h = 0x3ff0000000000000;
  r[0].val.s = (char *)0xbff0000000000000;
  cmp_gt(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
         in_stack_fffffffffffffff0,
         (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
         (char *)CONCAT44(very_tolerant.float_tolerance._4_4_,very_tolerant.float_tolerance._0_4_),
         in_stack_00000028);
  opt = (rtosc_cmp_options *)0x4000000000000000;
  cmp_1(very_tolerant.float_tolerance._4_4_,in_stack_00000018,in_stack_00000010,
        (size_t)in_stack_00000008,unaff_retaddr,(rtosc_cmp_options *)0x4000000000000000,
        in_stack_00000030,in_stack_00000038,in_stack_00000040);
  cmp_1(very_tolerant.float_tolerance._4_4_,in_stack_00000018,in_stack_00000010,
        (size_t)in_stack_00000008,unaff_retaddr,opt,in_stack_00000030,in_stack_00000038,
        in_stack_00000040);
  return;
}

Assistant:

void doubles()
{
    l[0].type = r[0].type = 'd';
    l[0].val.d = 123456790.123456789;
    r[0].val.d = 123456789.0;

    cmp_gt(l, r, 1, 1, NULL,
           "larger double value", "smaller double value", __LINE__);

    l[0].type = r[0].type = 'd';
    l[0].val.d = 1.0f;
    r[0].val.d = -1.0f;

    cmp_gt(l, r, 1, 1, NULL, "1.0", "-1.0", __LINE__);

    rtosc_cmp_options very_tolerant = { 2.0 };

    cmp_1(eq, l, r, 1, 1, &very_tolerant,
          "1.0", "-1.0 (2.0 tolerance)", __LINE__);
    cmp_1(eq, r, l, 1, 1, &very_tolerant,
          "-1.0", "1.0 (2.0 tolerance)", __LINE__);
}